

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode)

{
  bool bVar1;
  vector<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  *this_00;
  element_type *peVar2;
  allocator<char> local_2d1;
  string local_2d0;
  __shared_ptr_access<Catch::CumulativeReporterBase::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_2b0;
  shared_ptr<Catch::CumulativeReporterBase::SectionNode> *childNode;
  const_iterator __end1;
  const_iterator __begin1;
  ChildSections *__range1;
  allocator<char> local_269;
  string local_268 [32];
  undefined1 local_248 [16];
  string local_238;
  allocator<char> local_211;
  string local_210 [32];
  undefined1 local_1f0 [24];
  string local_1d8;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8 [32];
  undefined1 local_a8 [8];
  ScopedElement e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string name;
  SectionNode *sectionNode_local;
  string *rootName_local;
  string *className_local;
  JunitReporter *this_local;
  
  name.field_2._8_8_ = sectionNode;
  trim((string *)local_48,(string *)sectionNode);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (rootName);
  if (!bVar1) {
    std::operator+(&local_88,rootName,'/');
    std::operator+(&local_68,&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               &local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  bVar1 = std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::empty
                    ((vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *)
                     (name.field_2._8_8_ + 0x70));
  if (((!bVar1) ||
      (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (name.field_2._8_8_ + 0x88)), !bVar1)) ||
     (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (name.field_2._8_8_ + 0xa8)), !bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c8,"testcase",&local_c9);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_a8,(string *)&this->xml,(XmlFormatting)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (className);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"classname",&local_f1);
      XmlWriter::writeAttribute(&this->xml,&local_f0,(string *)local_48);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"name",&local_119);
      XmlWriter::writeAttribute<char[5]>(&this->xml,&local_118,(char (*) [5])"root");
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"classname",&local_141);
      XmlWriter::writeAttribute(&this->xml,&local_140,className);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"name",&local_169);
      XmlWriter::writeAttribute(&this->xml,&local_168,(string *)local_48);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"time",&local_191);
    Detail::stringify<double>(&local_1b8,(double *)(name.field_2._8_8_ + 0x48));
    XmlWriter::writeAttribute(&this->xml,&local_190,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"status",(allocator<char> *)(local_1f0 + 0x17));
    XmlWriter::writeAttribute<char[4]>(&this->xml,&local_1d8,(char (*) [4])0x21ac37);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)(local_1f0 + 0x17));
    writeAssertions(this,(SectionNode *)name.field_2._8_8_);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (name.field_2._8_8_ + 0x88));
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_210,"system-out",&local_211);
      operator|(Newline,Indent);
      XmlWriter::scopedElement((XmlWriter *)local_1f0,(string *)&this->xml,(XmlFormatting)local_210)
      ;
      trim((string *)(local_248 + 0x10),(string *)(name.field_2._8_8_ + 0x88));
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)local_1f0,(string *)(local_248 + 0x10),Newline);
      std::__cxx11::string::~string((string *)(local_248 + 0x10));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1f0);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator(&local_211);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (name.field_2._8_8_ + 0xa8));
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_268,"system-err",&local_269);
      operator|(Newline,Indent);
      XmlWriter::scopedElement((XmlWriter *)local_248,(string *)&this->xml,(XmlFormatting)local_268)
      ;
      trim((string *)&__range1,(string *)(name.field_2._8_8_ + 0xa8));
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_248,(string *)&__range1,Newline);
      std::__cxx11::string::~string((string *)&__range1);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_248);
      std::__cxx11::string::~string(local_268);
      std::allocator<char>::~allocator(&local_269);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
  }
  this_00 = (vector<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
             *)(name.field_2._8_8_ + 0x58);
  __end1 = std::
           vector<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ::begin(this_00);
  childNode = (shared_ptr<Catch::CumulativeReporterBase::SectionNode> *)
              std::
              vector<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
              ::end(this_00);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                           (&__end1,(__normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                                     *)&childNode), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_2b0 = (__shared_ptr_access<Catch::CumulativeReporterBase::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                   ::operator*(&__end1);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (className);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"",&local_2d1);
      peVar2 = std::
               __shared_ptr_access<Catch::CumulativeReporterBase::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(local_2b0);
      writeSection(this,(string *)local_48,&local_2d0,peVar2);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator(&local_2d1);
    }
    else {
      peVar2 = std::
               __shared_ptr_access<Catch::CumulativeReporterBase::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(local_2b0);
      writeSection(this,className,(string *)local_48,peVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void JunitReporter::writeSection(std::string const &className,
        std::string const &rootName,
        SectionNode const &sectionNode) {
        std::string name = trim(sectionNode.stats.sectionInfo.name);
        if (!rootName.empty())
            name = rootName + '/' + name;

        if (!sectionNode.assertions.empty() ||
            !sectionNode.stdOut.empty() ||
            !sectionNode.stdErr.empty()) {
            XmlWriter::ScopedElement e = xml.scopedElement("testcase");
            if (className.empty()) {
                xml.writeAttribute("classname", name);
                xml.writeAttribute("name", "root");
            }
            else {
                xml.writeAttribute("classname", className);
                xml.writeAttribute("name", name);
            }
            xml.writeAttribute("time", ::Catch::Detail::stringify(sectionNode.stats.durationInSeconds));
            // This is not ideal, but it should be enough to mimic gtest's
            // junit output.
            // Ideally the JUnit reporter would also handle `skipTest`
            // events and write those out appropriately.
            xml.writeAttribute("status", "run");

            writeAssertions(sectionNode);

            if (!sectionNode.stdOut.empty())
                xml.scopedElement("system-out").writeText(trim(sectionNode.stdOut), XmlFormatting::Newline);
            if (!sectionNode.stdErr.empty())
                xml.scopedElement("system-err").writeText(trim(sectionNode.stdErr), XmlFormatting::Newline);
        }
        for (auto const &childNode : sectionNode.childSections)
            if (className.empty())
                writeSection(name, "", *childNode);
            else
                writeSection(className, name, *childNode);
    }